

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void xc_lda_sanity_check(xc_func_info_type *info,int order,xc_lda_out_params *out)

{
  char *pcVar1;
  char *__format;
  
  if ((uint)order < 5) {
    if ((out->zk == (double *)0x0) || ((info->flags & 1) != 0)) {
      if ((out->vrho == (double *)0x0) || ((info->flags & 2) != 0)) {
        if ((out->v2rho2 == (double *)0x0) || ((info->flags & 4) != 0)) {
          if ((out->v3rho3 == (double *)0x0) || ((info->flags & 8) != 0)) {
            return;
          }
          pcVar1 = info->name;
          __format = "Functional \'%s\' does not provide an implementation of kxc\n";
        }
        else {
          pcVar1 = info->name;
          __format = "Functional \'%s\' does not provide an implementation of fxc\n";
        }
      }
      else {
        pcVar1 = info->name;
        __format = "Functional \'%s\' does not provide an implementation of vxc\n";
      }
    }
    else {
      pcVar1 = info->name;
      __format = "Functional \'%s\' does not provide an implementation of Exc\n";
    }
    fprintf(_stderr,__format,pcVar1);
  }
  else {
    fprintf(_stderr,"Order of derivatives \'%d\' not implemented\n",(ulong)(uint)order);
  }
  exit(1);
}

Assistant:

void
xc_lda_sanity_check(const xc_func_info_type *info, int order, xc_lda_out_params *out)
{
  /* sanity check */
  if(order < 0 || order > 4){
    fprintf(stderr, "Order of derivatives '%d' not implemented\n",
	    order);
    exit(1);
  }

  if(out->zk != NULL && !(info->flags & XC_FLAGS_HAVE_EXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of Exc\n",
	    info->name);
    exit(1);
  }

  if(out->vrho != NULL && !(info->flags & XC_FLAGS_HAVE_VXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of vxc\n",
	    info->name);
    exit(1);
  }

  if(out->v2rho2 != NULL && !(info->flags & XC_FLAGS_HAVE_FXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of fxc\n",
	    info->name);
    exit(1);
  }

  if(out->v3rho3 != NULL && !(info->flags & XC_FLAGS_HAVE_KXC)){
    fprintf(stderr, "Functional '%s' does not provide an implementation of kxc\n",
	    info->name);
    exit(1);
  }
}